

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String __thiscall
doctest::detail::stringifyBinaryExpr<long_long,int>(detail *this,longlong *lhs,char *op,int *rhs)

{
  char buf [64];
  String local_98;
  String local_90;
  String local_88;
  String local_80;
  char local_78 [72];
  
  sprintf(local_78,"%lld",*lhs);
  String::String(&local_88,local_78);
  String::String(&local_90,op);
  String::operator+(&local_80,&local_88);
  sprintf(local_78,"%d",(ulong)(uint)*rhs);
  String::String(&local_98,local_78);
  String::operator+((String *)this,&local_80);
  free(local_98.m_str);
  free(local_80.m_str);
  free(local_90.m_str);
  free(local_88.m_str);
  return (String)(char *)this;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return toString(lhs) + op + toString(rhs);
    }